

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer.cpp
# Opt level: O0

Vec2 __thiscall Randomizer::randPosition(Randomizer *this)

{
  float _x;
  float _y;
  Randomizer *this_local;
  
  _x = randXAxis(this);
  _y = randYAxis(this);
  Vec2::Vec2((Vec2 *)&this_local,_x,_y);
  return (Vec2)this_local;
}

Assistant:

Vec2 Randomizer::randPosition()
{
    return Vec2(randXAxis(), randYAxis());
}